

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAPOFX_echo.c
# Opt level: O0

uint32_t FAPOFXCreateEcho(FAPO **pEffect,void *pInitData,uint32_t InitDataByteSize,
                         FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
                         FAudioReallocFunc customRealloc,uint8_t legacy)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  FAudioMallocFunc in_RCX;
  uint in_EDX;
  long in_RSI;
  FAPORegistrationProperties *pRegistrationProperties;
  undefined8 *in_RDI;
  FAudioFreeFunc in_R8;
  FAudioReallocFunc in_R9;
  char in_stack_00000008;
  SDL_AssertState sdl_assert_state;
  uint8_t *params;
  FAPOFXEcho *result;
  FAPOFXEchoParameters fxdefault;
  undefined8 local_3c;
  undefined4 local_34;
  FAudioReallocFunc local_30;
  FAudioFreeFunc local_28;
  FAudioMallocFunc local_20;
  uint local_14;
  long local_10;
  undefined8 *local_8;
  
  local_3c = 0x3f0000003f000000;
  local_34 = 0x43fa0000;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fapo = (FAPOBase *)(*in_RCX)(0xe0);
  pParameterBlocks = (uint8_t *)(*local_20)(0x24);
  if (local_10 == 0) {
    SDL_memset(pParameterBlocks,0,0x24);
    SDL_memcpy(pParameterBlocks,&local_3c,0xc);
    SDL_memcpy(pParameterBlocks + 0xc,&local_3c,0xc);
    SDL_memcpy(pParameterBlocks + 0x18,&local_3c,0xc);
  }
  else {
    do {
      if (local_14 == 0xc) goto LAB_001237d8;
      iVar2 = SDL_ReportAssertion(&FAPOFXCreateEcho::sdl_assert_data,"FAPOFXCreateEcho",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAPOFX_echo.c"
                                  ,0xd0);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_001237d8:
    SDL_memcpy(pParameterBlocks,local_10,local_14);
    SDL_memcpy(pParameterBlocks + local_14,local_10,local_14);
    SDL_memcpy(pParameterBlocks + (local_14 << 1),local_10,local_14);
  }
  SDL_memcpy(&FXEchoProperties_LEGACY,&FAPOFX_CLSID_FXEcho_LEGACY,0x10);
  SDL_memcpy(&FXEchoProperties,&FAPOFX_CLSID_FXEcho,0x10);
  pRegistrationProperties = &FXEchoProperties;
  if (in_stack_00000008 != '\0') {
    pRegistrationProperties = &FXEchoProperties_LEGACY;
  }
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,pRegistrationProperties,pParameterBlocks,0xc,'\0',local_20,local_28,local_30);
  (fapo->base).Initialize = FAPOFXEcho_Initialize;
  (fapo->base).Process = FAPOFXEcho_Process;
  fapo->Destructor = FAPOFXEcho_Free;
  *local_8 = fapo;
  return 0;
}

Assistant:

uint32_t FAPOFXCreateEcho(
	FAPO **pEffect,
	const void *pInitData,
	uint32_t InitDataByteSize,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc,
	uint8_t legacy
) {
	const FAPOFXEchoParameters fxdefault =
	{
		FAPOFXECHO_DEFAULT_WETDRYMIX,
		FAPOFXECHO_DEFAULT_FEEDBACK,
		FAPOFXECHO_DEFAULT_DELAY
	};

	/* Allocate... */
	FAPOFXEcho *result = (FAPOFXEcho*) customMalloc(
		sizeof(FAPOFXEcho)
	);
	uint8_t *params = (uint8_t*) customMalloc(
		sizeof(FAPOFXEchoParameters) * 3
	);
	if (pInitData == NULL)
	{
		FAudio_zero(params, sizeof(FAPOFXEchoParameters) * 3);
		#define INITPARAMS(offset) \
			FAudio_memcpy( \
				params + sizeof(FAPOFXEchoParameters) * offset, \
				&fxdefault, \
				sizeof(FAPOFXEchoParameters) \
			);
		INITPARAMS(0)
		INITPARAMS(1)
		INITPARAMS(2)
		#undef INITPARAMS
	}
	else
	{
		FAudio_assert(InitDataByteSize == sizeof(FAPOFXEchoParameters));
		FAudio_memcpy(params, pInitData, InitDataByteSize);
		FAudio_memcpy(params + InitDataByteSize, pInitData, InitDataByteSize);
		FAudio_memcpy(params + (InitDataByteSize * 2), pInitData, InitDataByteSize);
	}

	/* Initialize... */
	FAudio_memcpy(
		&FXEchoProperties_LEGACY.clsid,
		&FAPOFX_CLSID_FXEcho_LEGACY,
		sizeof(FAudioGUID)
	);
	FAudio_memcpy(
		&FXEchoProperties.clsid,
		&FAPOFX_CLSID_FXEcho,
		sizeof(FAudioGUID)
	);
	CreateFAPOBaseWithCustomAllocatorEXT(
		&result->base,
		legacy ? &FXEchoProperties_LEGACY : &FXEchoProperties,
		params,
		sizeof(FAPOFXEchoParameters),
		0,
		customMalloc,
		customFree,
		customRealloc
	);

	/* Function table... */
	result->base.base.Initialize = (InitializeFunc)
		FAPOFXEcho_Initialize;
	result->base.base.Process = (ProcessFunc)
		FAPOFXEcho_Process;
	result->base.Destructor = FAPOFXEcho_Free;

	/* Finally. */
	*pEffect = &result->base.base;
	return 0;
}